

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_del.c
# Opt level: O1

int mpt_path_del(mpt_path *path)

{
  size_t sVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  uint8_t *puVar6;
  ulong len;
  ulong uVar7;
  mpt_array local_28;
  
  uVar4 = path->len;
  if (uVar4 == 0) {
    return -0x10;
  }
  pcVar3 = path->base;
  sVar1 = path->off;
  if ((char)path->flags < '\0') {
    if (uVar4 == 1) {
      return -2;
    }
    uVar7 = (ulong)(byte)pcVar3[sVar1 + uVar4 + -2];
    lVar5 = uVar4 - uVar7;
    if (uVar4 < uVar7 || lVar5 == 0) {
      return -2;
    }
    puVar6 = (uint8_t *)(pcVar3 + lVar5 + sVar1 + -3);
    if (lVar5 + sVar1 == 2) {
      puVar6 = &path->first;
    }
    if (pcVar3[sVar1 + uVar4 + -2] != *puVar6) {
      return -4;
    }
    len = lVar5 - 2;
  }
  else {
    uVar4 = uVar4 - 1;
    if (uVar4 == 0) {
      len = 0;
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      len = uVar4;
      do {
        if ((uint)(byte)pcVar3[len + (sVar1 - 1)] == (int)path->sep) goto LAB_0010dd68;
        uVar7 = uVar7 + 1;
        len = len - 1;
      } while (len != 0);
      len = 0;
      uVar7 = uVar4;
    }
  }
LAB_0010dd68:
  if ((path->flags & 0x40) != 0) {
    local_28._buf = (mpt_buffer *)(pcVar3 + -0x20);
    if (*(ulong *)(pcVar3 + -8) < len) {
      local_28._buf = (mpt_buffer *)0xfffffffe;
      bVar2 = false;
    }
    else {
      bVar2 = false;
      pcVar3 = (char *)mpt_array_slice(&local_28,0,len);
      if (pcVar3 == (char *)0x0) {
        local_28._buf = (mpt_buffer *)0xfffffffc;
      }
      else {
        path->base = pcVar3;
        (local_28._buf)->_used = len;
        bVar2 = true;
      }
    }
    if (!bVar2) {
      return (int)local_28._buf;
    }
  }
  path->len = len;
  if (len == 0) {
    path->first = '\0';
  }
  path->flags = path->flags & 0xfe;
  return (int)uVar7;
}

Assistant:

extern int mpt_path_del(MPT_STRUCT(path) *path)
{
	uint8_t *data;
	size_t len, pos, part;
	
	if (!(len = path->len)) {
		return MPT_ERROR(MissingData);
	}
	data = (uint8_t *) path->base;
	pos  = len + path->off;
	
	/* binary linked size separation format */
	if (path->flags & MPT_PATHFLAG(SepBinary)) {
		/* total length error */
		if (len < 2 || len <= (part = data[pos-2])) {
			return MPT_ERROR(BadValue);
		}
		len -= part + 2;
		pos  = len + path->off;
		
		/* forward/backward inconsistency */
		if (part != (pos ? data[pos-1] : path->first)) {
			return MPT_ERROR(BadOperation);
		}
	}
	else {
		/* start on character before assign */
		data += (pos - 2);
		part  = 0;
		
		/* find last separator */
		while (--len && (*(data) != path->sep)) {
			++part; --data;
		}
	}
	if (path->flags & MPT_PATHFLAG(HasArray)) {
		MPT_STRUCT(array) arr;
		arr._buf = (void *) path->base;
		pos = (--arr._buf)->_used;
		if (len > pos) {
			return MPT_ERROR(BadValue);
		}
		pos = len;
		if (!(data = mpt_array_slice(&arr, 0, pos))) {
			return MPT_ERROR(BadOperation);
		}
		path->base = (char *) data;
		arr._buf->_used = pos;
	}
	
	if (!(path->len = len)) {
		path->first = 0;
	}
	path->flags &= ~MPT_PATHFLAG(KeepPost);
	
	return part;
}